

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O3

int __thiscall
jrtplib::RTPSources::ProcessRTPPacket
          (RTPSources *this,RTPPacket *rtppack,RTPTime *receivetime,RTPAddress *senderaddress,
          bool *stored)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  RTPAddress *pRVar4;
  RTPMemoryManager *pRVar5;
  RTPInternalSourceData *pRVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  uint32_t uVar10;
  int iVar11;
  undefined4 extraout_var;
  ulong uVar12;
  ulong uVar13;
  bool createdcsrc;
  bool created;
  int num;
  RTPInternalSourceData *csrcdat;
  RTPInternalSourceData *srcdat;
  uint32_t CSRCs [15];
  bool local_aa;
  bool local_a9;
  RTPAddress *local_a8;
  RTPMemoryManager *local_a0;
  RTPTime *local_98;
  bool *local_90;
  RTPInternalSourceData *local_88;
  RTPInternalSourceData *local_80;
  uint32_t auStack_78 [18];
  
  (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[2])();
  *stored = false;
  iVar8 = ObtainSourceDataInstance(this,rtppack->ssrc,&local_80,&local_a9);
  if (-1 < iVar8) {
    local_98 = receivetime;
    local_90 = stored;
    if (local_a9 == true) {
      if (senderaddress == (RTPAddress *)0x0) {
        pRVar4 = (local_80->super_RTPSourceData).rtpaddr;
        if (pRVar4 != (RTPAddress *)0x0) {
          local_a8 = (RTPAddress *)(local_80->super_RTPSourceData).super_RTPMemoryObject.mgr;
          if (local_a8 == (RTPAddress *)0x0) {
            (*pRVar4->_vptr_RTPAddress[4])(pRVar4);
          }
          else {
            (*pRVar4->_vptr_RTPAddress[3])(pRVar4);
            (**(code **)(*(long *)local_a8 + 0x18))(local_a8,pRVar4);
          }
          (local_80->super_RTPSourceData).rtpaddr = (RTPAddress *)0x0;
        }
      }
      else {
        iVar8 = (**senderaddress->_vptr_RTPAddress)
                          (senderaddress,(local_80->super_RTPSourceData).super_RTPMemoryObject.mgr);
        local_a8 = (RTPAddress *)CONCAT44(extraout_var,iVar8);
        if (local_a8 == (RTPAddress *)0x0) {
          return -1;
        }
        pRVar4 = (local_80->super_RTPSourceData).rtpaddr;
        if (pRVar4 != senderaddress && pRVar4 != (RTPAddress *)0x0) {
          pRVar5 = (local_80->super_RTPSourceData).super_RTPMemoryObject.mgr;
          if (pRVar5 == (RTPMemoryManager *)0x0) {
            (*pRVar4->_vptr_RTPAddress[4])(pRVar4);
          }
          else {
            local_a0 = pRVar5;
            (*pRVar4->_vptr_RTPAddress[3])(pRVar4);
            (**(code **)(*(long *)local_a0 + 0x18))(local_a0,pRVar4);
          }
        }
        (local_80->super_RTPSourceData).rtpaddr = local_a8;
      }
      (local_80->super_RTPSourceData).isrtpaddrset = true;
    }
    else {
      bVar7 = CheckCollision(this,local_80,senderaddress,true);
      if (bVar7) {
        return 0;
      }
    }
    bVar7 = (local_80->super_RTPSourceData).issender;
    bVar1 = (local_80->super_RTPSourceData).receivedbye;
    bVar2 = (local_80->super_RTPSourceData).validated;
    uVar3 = rtppack->numcsrcs;
    uVar9 = 0xf;
    if ((int)uVar3 < 0xf) {
      uVar9 = uVar3;
    }
    local_a0 = (RTPMemoryManager *)CONCAT44(local_a0._4_4_,uVar9);
    local_a8 = senderaddress;
    if (0 < (int)uVar3) {
      uVar12 = 0;
      do {
        uVar10 = RTPPacket::GetCSRC(rtppack,(int)uVar12);
        auStack_78[uVar12] = uVar10;
        uVar12 = uVar12 + 1;
      } while (uVar9 != uVar12);
    }
    iVar8 = RTPInternalSourceData::ProcessRTPPacket(local_80,rtppack,local_98,local_90,this);
    if (-1 < iVar8) {
      if ((bVar7 == false) && ((local_80->super_RTPSourceData).issender == true)) {
        this->sendercount = this->sendercount + 1;
      }
      if ((((bVar2 == false) || ((bVar1 & 1U) != 0)) &&
          ((local_80->super_RTPSourceData).validated == true)) &&
         (((local_80->super_RTPSourceData).receivedbye & 1U) == 0)) {
        this->activecount = this->activecount + 1;
      }
      if (local_a9 != false) {
        (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[6])(this,local_80);
      }
      iVar8 = 0;
      if (((local_80->super_RTPSourceData).validated == true) && (0 < (int)uVar3)) {
        uVar12 = (ulong)local_a0 & 0xffffffff;
        uVar13 = 0;
        do {
          iVar11 = ObtainSourceDataInstance(this,auStack_78[uVar13],&local_88,&local_aa);
          pRVar6 = local_88;
          if (iVar11 < 0) {
            return iVar11;
          }
          if (local_aa == true) {
            (local_88->super_RTPSourceData).validated = true;
            (local_88->super_RTPSourceData).iscsrc = true;
            if (((local_88->super_RTPSourceData).receivedbye & 1U) == 0) {
              this->activecount = this->activecount + 1;
            }
            (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[6])(this,local_88);
          }
          else {
            bVar7 = CheckCollision(this,local_88,local_a8,true);
            if (!bVar7) {
              (pRVar6->super_RTPSourceData).validated = true;
              (pRVar6->super_RTPSourceData).iscsrc = true;
            }
          }
          uVar13 = uVar13 + 1;
        } while (uVar12 != uVar13);
      }
    }
  }
  return iVar8;
}

Assistant:

int RTPSources::ProcessRTPPacket(RTPPacket *rtppack,const RTPTime &receivetime,const RTPAddress *senderaddress,bool *stored)
{
	uint32_t ssrc;
	RTPInternalSourceData *srcdat;
	int status;
	bool created;

	OnRTPPacket(rtppack,receivetime,senderaddress);

	*stored = false;
	
	ssrc = rtppack->GetSSRC();
	if ((status = ObtainSourceDataInstance(ssrc,&srcdat,&created)) < 0)
		return status;

	if (created)
	{
		if ((status = srcdat->SetRTPDataAddress(senderaddress)) < 0)
			return status;
	}
	else // got a previously existing source
	{
		if (CheckCollision(srcdat,senderaddress,true))
			return 0; // ignore packet on collision
	}
	
	bool prevsender = srcdat->IsSender();
	bool prevactive = srcdat->IsActive();
	
	uint32_t CSRCs[RTP_MAXCSRCS];
	int numCSRCs = rtppack->GetCSRCCount();
	if (numCSRCs > RTP_MAXCSRCS) // shouldn't happen, but better to check than go out of bounds
		numCSRCs = RTP_MAXCSRCS;

	for (int i = 0 ; i < numCSRCs ; i++)
		CSRCs[i] = rtppack->GetCSRC(i);

	// The packet comes from a valid source, we can process it further now
	// The following function should delete rtppack itself if something goes
	// wrong
	if ((status = srcdat->ProcessRTPPacket(rtppack,receivetime,stored,this)) < 0)
		return status;

	// NOTE: we cannot use 'rtppack' anymore since it may have been deleted in
	//       OnValidatedRTPPacket

	if (!prevsender && srcdat->IsSender())
		sendercount++;
	if (!prevactive && srcdat->IsActive())
		activecount++;

	if (created)
		OnNewSource(srcdat);

	if (srcdat->IsValidated()) // process the CSRCs
	{
		RTPInternalSourceData *csrcdat;
		bool createdcsrc;

		int num = numCSRCs;
		int i;

		for (i = 0 ; i < num ; i++)
		{
			if ((status = ObtainSourceDataInstance(CSRCs[i],&csrcdat,&createdcsrc)) < 0)
				return status;
			if (createdcsrc)
			{
				csrcdat->SetCSRC();
				if (csrcdat->IsActive())
					activecount++;
				OnNewSource(csrcdat);
			}
			else // already found an entry, possibly because of RTCP data
			{
				if (!CheckCollision(csrcdat,senderaddress,true))
					csrcdat->SetCSRC();
			}
		}
	}
	
	return 0;
}